

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP3Writer::DoPutSync
          (BP3Writer *this,Variable<long_double> *variable,longdouble *data)

{
  int iVar1;
  BPInfo *pBVar2;
  ScopedTimer __var2167;
  ScopedTimer local_20;
  
  if (DoPutSync(adios2::core::Variable<long_double>&,long_double_const*)::__var167 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutSync(adios2::core::Variable<long_double>&,long_double_const*)
                                 ::__var167);
    if (iVar1 != 0) {
      DoPutSync::__var167 = (void *)ps_timer_create_("BP3Writer::Put");
      __cxa_guard_release(&DoPutSync(adios2::core::Variable<long_double>&,long_double_const*)::
                           __var167);
    }
  }
  local_20.m_timer = DoPutSync::__var167;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  pBVar2 = Variable<long_double>::SetBlockInfo
                     (variable,data,
                      *(size_t *)
                       ((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x1d8 +
                       (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),1);
  PutSyncCommon<long_double>(this,variable,pBVar2,true);
  pBVar2 = (variable->m_BlocksInfo).
           super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  (variable->m_BlocksInfo).
  super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  Variable<long_double>::BPInfo::~BPInfo(pBVar2);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_20);
  return;
}

Assistant:

void BP3Writer::InitParameters()
{
    m_BP3Serializer.Init(m_IO.m_Parameters, "in call to BP3::Open for writing");
    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP3::Open to write");
}